

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.h
# Opt level: O0

bool __thiscall pbrt::BSDF::IsGlossy(BSDF *this)

{
  BxDFFlags a;
  int iVar1;
  
  a = BxDFHandle::Flags((BxDFHandle *)this);
  iVar1 = operator&(a,Glossy);
  return iVar1 != 0;
}

Assistant:

PBRT_CPU_GPU
    bool IsGlossy() const { return (bxdf.Flags() & BxDFFlags::Glossy); }